

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O1

vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *
dg::getCalledFunctions
          (vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
           *__return_storage_ptr__,Value *calledValue,LLVMPointerAnalysis *PTA)

{
  pointer *pppFVar1;
  iterator __position;
  char cVar2;
  bool bVar3;
  const_iterator __begin1;
  Function *F;
  const_iterator __end1;
  const_iterator local_48;
  Function *local_40;
  const_iterator local_38;
  LLVMPointsToSetImpl *local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*(long *)PTA + 8))(&local_30,PTA,calledValue);
  local_48.impl = local_30;
  if (local_30 != (LLVMPointsToSetImpl *)0x0) {
    cVar2 = (**(code **)(*(long *)local_30 + 0x38))(local_30);
    if (cVar2 != '\0') {
      local_48.impl = (LLVMPointsToSetImpl *)0x0;
    }
  }
  local_38.impl = (LLVMPointsToSetImpl *)0x0;
  bVar3 = LLVMPointsToSet::const_iterator::operator==(&local_48,&local_38);
  if (!bVar3) {
    do {
      local_40 = (Function *)(**(code **)(*(long *)local_48.impl + 0x48))();
      if (local_40[0x10] != (Function)0x0) {
        local_40 = (Function *)0x0;
      }
      if (local_40 != (Function *)0x0) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
          _M_realloc_insert<llvm::Function_const*const&>
                    ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)
                     __return_storage_ptr__,__position,&local_40);
        }
        else {
          *__position._M_current = local_40;
          pppFVar1 = &(__return_storage_ptr__->
                      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppFVar1 = *pppFVar1 + 1;
        }
      }
      (**(code **)(*(long *)local_48.impl + 0x40))();
      cVar2 = (**(code **)(*(long *)local_48.impl + 0x38))();
      if (cVar2 != '\0') {
        local_48.impl = (LLVMPointsToSetImpl *)0x0;
      }
      bVar3 = LLVMPointsToSet::const_iterator::operator==(&local_48,&local_38);
    } while (!bVar3);
  }
  if (local_30 != (LLVMPointsToSetImpl *)0x0) {
    (**(code **)(*(long *)local_30 + 0x58))();
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<const llvm::Function *>
getCalledFunctions(const llvm::Value *calledValue, LLVMPointerAnalysis *PTA) {
    std::vector<const llvm::Function *> functions;
    for (const auto &llvmptr : PTA->getLLVMPointsTo(calledValue)) {
        if (auto *const F = llvm::dyn_cast<llvm::Function>(llvmptr.value)) {
            functions.push_back(F);
        }
    }
    return functions;
}